

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O2

shared_ptr<QPDFObject>
QPDFObject::create<QPDF_InlineImage,std::__cxx11::string_const&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  shared_ptr<QPDFObject> sVar1;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  undefined8 uStack_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [8];
  undefined8 uStack_18;
  
  std::__cxx11::string::string((string *)&local_50,in_RSI);
  local_30 = local_20;
  if (local_50 == local_40) {
    uStack_18 = uStack_38;
  }
  else {
    local_30 = local_50;
  }
  local_28 = local_48;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  std::make_shared<QPDFObject,QPDF_InlineImage>((QPDF_InlineImage *)args);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)args;
  return (shared_ptr<QPDFObject>)sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<QPDFObject>
QPDFObject::create(Args&&... args)
{
    return std::make_shared<QPDFObject>(std::forward<T>(T(std::forward<Args>(args)...)));
}